

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O1

void __thiscall
QTreeWidgetItem::QTreeWidgetItem(QTreeWidgetItem *this,QTreeWidget *treeview,int type)

{
  QTreeWidgetItem *this_00;
  QTreeWidgetItemPrivate *pQVar1;
  QTreeModel *pQVar2;
  
  this->_vptr_QTreeWidgetItem = (_func_int **)&PTR__QTreeWidgetItem_0081e7f0;
  this->rtti = type;
  (this->values).d.d = (Data *)0x0;
  (this->values).d.ptr = (QList<QWidgetItemData> *)0x0;
  (this->values).d.size = 0;
  this->view = (QTreeWidget *)0x0;
  pQVar1 = (QTreeWidgetItemPrivate *)operator_new(0x30);
  pQVar1->q = this;
  (pQVar1->display).d.d = (Data *)0x0;
  (pQVar1->display).d.ptr = (QVariant *)0x0;
  (pQVar1->display).d.size = 0;
  pQVar1->field_0x20 = pQVar1->field_0x20 & 0xf8;
  pQVar1->rowGuess = -1;
  pQVar1->policy = DontShowIndicatorWhenChildless;
  this->d = pQVar1;
  (this->children).d.ptr = (QTreeWidgetItem **)0x0;
  (this->children).d.size = 0;
  this->par = (QTreeWidgetItem *)0x0;
  (this->children).d.d = (Data *)0x0;
  (this->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i =
       0x3d;
  pQVar2 = treeModel(this,treeview);
  if (pQVar2 != (QTreeModel *)0x0) {
    this_00 = pQVar2->rootItem;
    insertChild(this_00,(int)(this_00->children).d.size,this);
    this->d->rowGuess = (int)(this_00->children).d.size + -1;
    QList<QList<QWidgetItemData>_>::reserve
              (&this->values,(long)(int)(pQVar2->headerItem->values).d.size);
    return;
  }
  return;
}

Assistant:

QTreeWidgetItem::QTreeWidgetItem(QTreeWidget *treeview, int type)
    : rtti(type), d(new QTreeWidgetItemPrivate(this))
{
    // do not set this->view here otherwise insertChild() will fail
    if (QTreeModel *model = treeModel(treeview)) {
        model->rootItem->addChild(this);
        values.reserve(model->headerItem->columnCount());
    }
}